

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

void stbtt__dict_get_ints(stbtt__buf *b,int key,int outcount,stbtt_uint32 *out)

{
  int o;
  byte bVar1;
  int iVar2;
  uint uVar3;
  stbtt_uint32 sVar4;
  uchar *puVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  stbtt__buf operands;
  
  stbtt__buf_seek(b,0);
  do {
    o = b->cursor;
    iVar2 = b->size;
    iVar8 = o;
    if (iVar2 <= o) {
      if (iVar2 < 0) {
        puVar5 = (uchar *)0x0;
      }
      else {
        puVar5 = b->data;
      }
      operands.cursor = 0;
      operands.size = 0;
      operands.data = puVar5;
      goto LAB_0014a442;
    }
    while ((iVar8 < iVar2 && (0x1b < b->data[iVar8]))) {
      if (b->data[iVar8] == 0x1e) {
        stbtt__buf_skip(b,1);
        do {
          if ((b->size <= b->cursor) || (bVar1 = stbtt__buf_get8(b), (~bVar1 & 0xf) == 0)) break;
        } while ((bVar1 & 0xf0) != 0xf0);
      }
      else {
        stbtt__cff_int(b);
      }
      iVar2 = b->size;
      iVar8 = b->cursor;
    }
    bVar1 = stbtt__buf_get8(b);
    if (bVar1 == 0xc) {
      bVar1 = stbtt__buf_get8(b);
      uVar3 = bVar1 | 0x100;
    }
    else {
      uVar3 = (uint)bVar1;
    }
  } while (uVar3 != key);
  operands = stbtt__buf_range(b,o,iVar8 - o);
LAB_0014a442:
  uVar7 = operands._8_8_;
  uVar6 = uVar7 >> 0x20;
  lVar9 = 0;
  while ((lVar9 < outcount && ((int)uVar7 < (int)uVar6))) {
    sVar4 = stbtt__cff_int(&operands);
    out[lVar9] = sVar4;
    lVar9 = lVar9 + 1;
    uVar6 = (ulong)(uint)operands.size;
    uVar7 = (ulong)(uint)operands.cursor;
  }
  return;
}

Assistant:

static void stbtt__dict_get_ints(stbtt__buf *b, int key, int outcount, stbtt_uint32 *out)
{
   int i;
   stbtt__buf operands = stbtt__dict_get(b, key);
   for (i = 0; i < outcount && operands.cursor < operands.size; i++)
      out[i] = stbtt__cff_int(&operands);
}